

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon,REF_GRID ref_grid)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint uVar2;
  void *__ptr;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  REF_EDGE ref_edge;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  double local_88;
  
  ref_node = ref_grid->node;
  lVar9 = (long)ref_node->max;
  if (lVar9 < 0) {
    pcVar8 = "malloc radius of REF_DBL negative";
    uVar5 = 0x4da;
LAB_001b0863:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar5,
           "ref_recon_roundoff_limit",pcVar8);
    RVar6 = 1;
  }
  else {
    __ptr = malloc(lVar9 * 8);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4da
             ,"ref_recon_roundoff_limit","malloc radius of REF_DBL NULL");
      RVar6 = 2;
    }
    else {
      for (lVar3 = 0; lVar9 != lVar3; lVar3 = lVar3 + 1) {
        *(undefined8 *)((long)__ptr + lVar3 * 8) = 0xbff0000000000000;
      }
      uVar2 = ref_edge_create(&ref_edge,ref_grid);
      if (uVar2 == 0) {
        uVar4 = 0;
        uVar7 = (ulong)(uint)ref_edge->n;
        if (ref_edge->n < 1) {
          uVar7 = uVar4;
        }
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          lVar3 = (long)ref_edge->e2n[uVar4 * 2];
          lVar9 = (long)ref_edge->e2n[uVar4 * 2 + 1];
          pRVar10 = ref_node->real;
          dVar13 = SQRT((pRVar10[lVar9 * 0xf + 2] - pRVar10[lVar3 * 0xf + 2]) *
                        (pRVar10[lVar9 * 0xf + 2] - pRVar10[lVar3 * 0xf + 2]) +
                        (pRVar10[lVar9 * 0xf + 1] - pRVar10[lVar3 * 0xf + 1]) *
                        (pRVar10[lVar9 * 0xf + 1] - pRVar10[lVar3 * 0xf + 1]) +
                        (pRVar10[lVar9 * 0xf] - pRVar10[lVar3 * 0xf]) *
                        (pRVar10[lVar9 * 0xf] - pRVar10[lVar3 * 0xf]));
          dVar12 = *(double *)((long)__ptr + lVar3 * 8);
          uVar11 = -(ulong)(dVar12 < 0.0);
          dVar12 = (double)(~uVar11 & (ulong)dVar12 | uVar11 & (ulong)dVar13);
          if (dVar13 <= dVar12) {
            dVar12 = dVar13;
          }
          *(double *)((long)__ptr + lVar3 * 8) = dVar12;
          dVar12 = *(double *)((long)__ptr + lVar9 * 8);
          uVar11 = -(ulong)(dVar12 < 0.0);
          dVar12 = (double)(~uVar11 & (ulong)dVar12 | uVar11 & (ulong)dVar13);
          if (dVar13 <= dVar12) {
            dVar12 = dVar13;
          }
          *(double *)((long)__ptr + lVar9 * 8) = dVar12;
        }
        ref_edge_free(ref_edge);
        pRVar10 = recon;
        for (lVar9 = 0; lVar9 < ref_node->max; lVar9 = lVar9 + 1) {
          if (-1 < ref_node->global[lVar9]) {
            dVar12 = *(double *)((long)__ptr + lVar9 * 8);
            dVar12 = dVar12 * dVar12;
            dVar13 = dVar12 * 1e+20;
            if (dVar13 <= -dVar13) {
              dVar13 = -dVar13;
            }
            if (dVar13 <= 4e-12) {
              pcVar8 = "element with zero edge length or missing element";
              uVar5 = 0x4f1;
              goto LAB_001b0863;
            }
            local_a8 = 4e-12 / dVar12;
            uStack_a0 = 0;
            uVar2 = ref_matrix_diag_m(pRVar10,(REF_DBL *)local_98);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4f8,"ref_recon_roundoff_limit",(ulong)uVar2,"eigen decomp");
              ref_matrix_show_m(pRVar10);
              ref_node_location(ref_node,(REF_INT)lVar9);
              printf("eig_floor %e radius %e\n");
              return uVar2;
            }
            auVar1._8_8_ = local_a8;
            auVar1._0_8_ = local_a8;
            local_98 = maxpd(local_98,auVar1);
            if (local_88 <= local_a8) {
              local_88 = local_a8;
            }
            uVar2 = ref_matrix_form_m((REF_DBL *)local_98,pRVar10);
            if (uVar2 != 0) {
              uVar7 = (ulong)uVar2;
              pcVar8 = "re-form hess";
              uVar5 = 0x4ff;
              goto LAB_001b0836;
            }
          }
          pRVar10 = pRVar10 + 6;
        }
        free(__ptr);
        uVar2 = ref_node_ghost_dbl(ref_node,recon,6);
        if (uVar2 == 0) {
          return 0;
        }
        uVar7 = (ulong)uVar2;
        pcVar8 = "update ghosts";
        uVar5 = 0x503;
      }
      else {
        uVar7 = (ulong)uVar2;
        pcVar8 = "edges";
        uVar5 = 0x4db;
      }
LAB_001b0836:
      RVar6 = (REF_STATUS)uVar7;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar5
             ,"ref_recon_roundoff_limit",uVar7,pcVar8);
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, node0, node1, edge;
  REF_DBL *radius, dist;
  REF_DBL round_off_jitter = 1.0e-12;
  REF_DBL eig_floor;
  REF_DBL diag_system[12];
  REF_EDGE ref_edge;

  ref_malloc_init(radius, ref_node_max(ref_node), REF_DBL, -1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    dist = sqrt(
        pow(ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0),
            2) +
        pow(ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0),
            2) +
        pow(ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0),
            2));
    if (radius[node0] < 0.0) radius[node0] = dist;
    radius[node0] = MIN(radius[node0], dist);
    if (radius[node1] < 0.0) radius[node1] = dist;
    radius[node1] = MIN(radius[node1], dist);
  }
  ref_edge_free(ref_edge);

  each_ref_node_valid_node(ref_node, node) {
    /* 2nd order central finite difference */
    RAS(ref_math_divisible((4 * round_off_jitter),
                           (radius[node] * radius[node])),
        "element with zero edge length or missing element");
    eig_floor = (4 * round_off_jitter) / (radius[node] * radius[node]);

    RSB(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp", {
      ref_matrix_show_m(&(recon[6 * node]));
      ref_node_location(ref_node, node);
      printf("eig_floor %e radius %e\n", eig_floor, radius[node]);
    });
    ref_matrix_eig(diag_system, 0) =
        MAX(ref_matrix_eig(diag_system, 0), eig_floor);
    ref_matrix_eig(diag_system, 1) =
        MAX(ref_matrix_eig(diag_system, 1), eig_floor);
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig(diag_system, 2), eig_floor);
    RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
  }
  ref_free(radius);

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}